

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrint(char *string)

{
  byte *pbVar1;
  uint __c;
  char *pch;
  byte bVar2;
  
  if ((string != (char *)0x0) && (bVar2 = *string, bVar2 != 0)) {
    pbVar1 = (byte *)(string + 1);
    do {
      if ((byte)(bVar2 - 0x20) < 0x5f) {
        __c = (uint)bVar2;
LAB_00106692:
        putchar(__c);
      }
      else {
        putchar(0x5c);
        if (bVar2 == 10) {
          __c = 0x6e;
          goto LAB_00106692;
        }
        if (bVar2 == 0xd) {
          __c = 0x72;
          goto LAB_00106692;
        }
        putchar(0x78);
        UnityPrintNumberHex((long)(char)pbVar1[-1],'\x02');
      }
      bVar2 = *pbVar1;
      pbVar1 = pbVar1 + 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

void UnityPrint(const char* string)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch)
        {
            /* printable characters plus CR & LF are printed */
            if ((*pch <= 126) && (*pch >= 32))
            {
                UNITY_OUTPUT_CHAR(*pch);
            }
            /* write escaped carriage returns */
            else if (*pch == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (*pch == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
#ifdef UNITY_OUTPUT_COLOR
            /* print ANSI escape code */
            else if (*pch == 27 && *(pch + 1) == '[')
            {
                while (*pch && *pch != 'm')
                {
                    UNITY_OUTPUT_CHAR(*pch);
                    pch++;
                }
                UNITY_OUTPUT_CHAR('m');
            }
#endif
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((UNITY_UINT)*pch, 2);
            }
            pch++;
        }
    }
}